

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass2
          (Impl *this,VkRenderPassCreateInfo2 *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo2 **out_create_info)

{
  VkAttachmentDescription2 *__src;
  VkSubpassDescription2 *__src_00;
  VkSubpassDependency2 *__src_01;
  VkAttachmentReference2 *pVVar1;
  void *pvVar2;
  VkImageLayout VVar3;
  VkImageAspectFlags VVar4;
  undefined4 uVar5;
  VkStructureType VVar6;
  undefined4 uVar7;
  VkRenderPassCreateInfo2 *__dest;
  VkAttachmentDescription2 *pVVar8;
  VkSubpassDescription2 *pVVar9;
  VkSubpassDependency2 *pVVar10;
  uint32_t *puVar11;
  VkAttachmentReference2 *pVVar12;
  uint32_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  void **ppvVar17;
  bool bVar18;
  size_t sVar19;
  ulong uVar20;
  bool bVar21;
  
  __dest = (VkRenderPassCreateInfo2 *)ScratchAllocator::allocate_raw(alloc,0x50,0x10);
  if (__dest != (VkRenderPassCreateInfo2 *)0x0) {
    memmove(__dest,create_info,0x50);
  }
  if ((ulong)__dest->attachmentCount == 0) {
    pVVar8 = (VkAttachmentDescription2 *)0x0;
  }
  else {
    __src = __dest->pAttachments;
    sVar19 = (ulong)__dest->attachmentCount * 0x38;
    pVVar8 = (VkAttachmentDescription2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
    if (pVVar8 != (VkAttachmentDescription2 *)0x0) {
      memmove(pVVar8,__src,sVar19);
    }
  }
  __dest->pAttachments = pVVar8;
  if ((ulong)__dest->subpassCount == 0) {
    pVVar9 = (VkSubpassDescription2 *)0x0;
  }
  else {
    __src_00 = __dest->pSubpasses;
    sVar19 = (ulong)__dest->subpassCount * 0x58;
    pVVar9 = (VkSubpassDescription2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
    if (pVVar9 != (VkSubpassDescription2 *)0x0) {
      memmove(pVVar9,__src_00,sVar19);
    }
  }
  __dest->pSubpasses = pVVar9;
  if ((ulong)__dest->dependencyCount == 0) {
    pVVar10 = (VkSubpassDependency2 *)0x0;
  }
  else {
    __src_01 = __dest->pDependencies;
    sVar19 = (ulong)__dest->dependencyCount * 0x30;
    pVVar10 = (VkSubpassDependency2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
    if (pVVar10 != (VkSubpassDependency2 *)0x0) {
      memmove(pVVar10,__src_01,sVar19);
    }
  }
  __dest->pDependencies = pVVar10;
  if ((ulong)__dest->correlatedViewMaskCount == 0) {
    puVar11 = (uint32_t *)0x0;
  }
  else {
    puVar13 = __dest->pCorrelatedViewMasks;
    sVar19 = (ulong)__dest->correlatedViewMaskCount << 2;
    puVar11 = (uint32_t *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
    if (puVar11 != (uint32_t *)0x0) {
      memmove(puVar11,puVar13,sVar19);
    }
  }
  __dest->pCorrelatedViewMasks = puVar11;
  pVVar8 = __dest->pAttachments;
  if (pVVar8 == (VkAttachmentDescription2 *)0x0) {
LAB_001301fc:
    pVVar9 = __dest->pSubpasses;
    if (pVVar9 != (VkSubpassDescription2 *)0x0) {
      uVar16 = (ulong)__dest->subpassCount;
      bVar21 = uVar16 == 0;
      if (!bVar21) {
        bVar21 = copy_pnext_chain(this,pVVar9->pNext,alloc,&pVVar9->pNext,(DynamicStateInfo *)0x0,0)
        ;
        if (!bVar21) {
          return false;
        }
        ppvVar17 = &pVVar9[1].pNext;
        uVar20 = 1;
        do {
          uVar14 = uVar20;
          if (uVar16 == uVar14) break;
          bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
          ppvVar17 = ppvVar17 + 0xb;
          uVar20 = uVar14 + 1;
        } while (bVar21);
        bVar21 = uVar16 <= uVar14;
      }
      if (!bVar21) goto LAB_00130642;
    }
    pVVar10 = __dest->pDependencies;
    if (pVVar10 != (VkSubpassDependency2 *)0x0) {
      uVar16 = (ulong)__dest->dependencyCount;
      bVar21 = uVar16 == 0;
      if (!bVar21) {
        bVar21 = copy_pnext_chain(this,pVVar10->pNext,alloc,&pVVar10->pNext,(DynamicStateInfo *)0x0,
                                  0);
        if (!bVar21) {
          return false;
        }
        ppvVar17 = &pVVar10[1].pNext;
        uVar20 = 1;
        do {
          uVar14 = uVar20;
          if (uVar16 == uVar14) break;
          bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
          ppvVar17 = ppvVar17 + 6;
          uVar20 = uVar14 + 1;
        } while (bVar21);
        bVar21 = uVar16 <= uVar14;
      }
      if (!bVar21) goto LAB_00130642;
    }
    if (__dest->subpassCount != 0) {
      uVar16 = 0;
      do {
        pVVar9 = __dest->pSubpasses;
        pVVar1 = pVVar9[uVar16].pDepthStencilAttachment;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          pVVar12 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
          if (pVVar12 != (VkAttachmentReference2 *)0x0) {
            VVar6 = pVVar1->sType;
            uVar7 = *(undefined4 *)&pVVar1->field_0x4;
            pvVar2 = pVVar1->pNext;
            VVar3 = pVVar1->layout;
            VVar4 = pVVar1->aspectMask;
            uVar5 = *(undefined4 *)&pVVar1->field_0x1c;
            pVVar12->attachment = pVVar1->attachment;
            pVVar12->layout = VVar3;
            pVVar12->aspectMask = VVar4;
            *(undefined4 *)&pVVar12->field_0x1c = uVar5;
            pVVar12->sType = VVar6;
            *(undefined4 *)&pVVar12->field_0x4 = uVar7;
            pVVar12->pNext = pvVar2;
          }
          pVVar9[uVar16].pDepthStencilAttachment = pVVar12;
        }
        pVVar1 = pVVar9[uVar16].pColorAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar9[uVar16].colorAttachmentCount == 0) {
            pVVar12 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar19 = (ulong)pVVar9[uVar16].colorAttachmentCount << 5;
            pVVar12 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
            if (pVVar12 != (VkAttachmentReference2 *)0x0) {
              memmove(pVVar12,pVVar1,sVar19);
            }
          }
          pVVar9[uVar16].pColorAttachments = pVVar12;
        }
        pVVar1 = pVVar9[uVar16].pResolveAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar9[uVar16].colorAttachmentCount == 0) {
            pVVar12 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar19 = (ulong)pVVar9[uVar16].colorAttachmentCount << 5;
            pVVar12 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
            if (pVVar12 != (VkAttachmentReference2 *)0x0) {
              memmove(pVVar12,pVVar1,sVar19);
            }
          }
          pVVar9[uVar16].pResolveAttachments = pVVar12;
        }
        pVVar1 = pVVar9[uVar16].pInputAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar9[uVar16].inputAttachmentCount == 0) {
            pVVar12 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar19 = (ulong)pVVar9[uVar16].inputAttachmentCount << 5;
            pVVar12 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
            if (pVVar12 != (VkAttachmentReference2 *)0x0) {
              memmove(pVVar12,pVVar1,sVar19);
            }
          }
          pVVar9[uVar16].pInputAttachments = pVVar12;
        }
        puVar11 = pVVar9[uVar16].pPreserveAttachments;
        if (puVar11 != (uint32_t *)0x0) {
          if ((ulong)pVVar9[uVar16].preserveAttachmentCount == 0) {
            puVar13 = (uint32_t *)0x0;
          }
          else {
            sVar19 = (ulong)pVVar9[uVar16].preserveAttachmentCount << 2;
            puVar13 = (uint32_t *)ScratchAllocator::allocate_raw(alloc,sVar19,0x10);
            if (puVar13 != (uint32_t *)0x0) {
              memmove(puVar13,puVar11,sVar19);
            }
          }
          pVVar9[uVar16].pPreserveAttachments = puVar13;
        }
        pVVar1 = pVVar9[uVar16].pColorAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          uVar20 = (ulong)pVVar9[uVar16].colorAttachmentCount;
          bVar21 = uVar20 == 0;
          if (!bVar21) {
            bVar21 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,
                                      (DynamicStateInfo *)0x0,0);
            if (!bVar21) {
              return false;
            }
            ppvVar17 = &pVVar1[1].pNext;
            uVar14 = 1;
            do {
              uVar15 = uVar14;
              if (uVar20 == uVar15) break;
              bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
              ppvVar17 = ppvVar17 + 4;
              uVar14 = uVar15 + 1;
            } while (bVar21);
            bVar21 = uVar20 <= uVar15;
          }
          if (!bVar21) goto LAB_00130642;
        }
        pVVar1 = pVVar9[uVar16].pInputAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          uVar20 = (ulong)pVVar9[uVar16].inputAttachmentCount;
          bVar21 = uVar20 == 0;
          if (!bVar21) {
            bVar21 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,
                                      (DynamicStateInfo *)0x0,0);
            if (!bVar21) {
              return false;
            }
            ppvVar17 = &pVVar1[1].pNext;
            uVar14 = 1;
            do {
              uVar15 = uVar14;
              if (uVar20 == uVar15) break;
              bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
              ppvVar17 = ppvVar17 + 4;
              uVar14 = uVar15 + 1;
            } while (bVar21);
            bVar21 = uVar20 <= uVar15;
          }
          if (!bVar21) goto LAB_00130642;
        }
        pVVar1 = pVVar9[uVar16].pResolveAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          uVar20 = (ulong)pVVar9[uVar16].colorAttachmentCount;
          bVar21 = uVar20 == 0;
          if (!bVar21) {
            bVar21 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,
                                      (DynamicStateInfo *)0x0,0);
            if (!bVar21) {
              return false;
            }
            ppvVar17 = &pVVar1[1].pNext;
            uVar14 = 1;
            do {
              uVar15 = uVar14;
              if (uVar20 == uVar15) break;
              bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
              ppvVar17 = ppvVar17 + 4;
              uVar14 = uVar15 + 1;
            } while (bVar21);
            bVar21 = uVar20 <= uVar15;
          }
          if (!bVar21) goto LAB_00130642;
        }
        pVVar1 = pVVar9[uVar16].pDepthStencilAttachment;
        if ((pVVar1 != (VkAttachmentReference2 *)0x0) &&
           (bVar21 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,
                                      (DynamicStateInfo *)0x0,0), !bVar21)) {
          return false;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < __dest->subpassCount);
    }
    bVar18 = false;
    bVar21 = copy_pnext_chain(this,create_info->pNext,alloc,&__dest->pNext,(DynamicStateInfo *)0x0,0
                             );
    if (bVar21) {
      *out_create_info = __dest;
      bVar18 = true;
    }
  }
  else {
    uVar16 = (ulong)__dest->attachmentCount;
    bVar21 = uVar16 == 0;
    if (!bVar21) {
      bVar21 = copy_pnext_chain(this,pVVar8->pNext,alloc,&pVVar8->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar21) {
        return false;
      }
      ppvVar17 = &pVVar8[1].pNext;
      uVar20 = 1;
      do {
        uVar14 = uVar20;
        if (uVar16 == uVar14) break;
        bVar21 = copy_pnext_chain(this,*ppvVar17,alloc,ppvVar17,(DynamicStateInfo *)0x0,0);
        ppvVar17 = ppvVar17 + 7;
        uVar20 = uVar14 + 1;
      } while (bVar21);
      bVar21 = uVar16 <= uVar14;
    }
    if (bVar21) goto LAB_001301fc;
LAB_00130642:
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass2(const VkRenderPassCreateInfo2 *create_info, ScratchAllocator &alloc,
                                            VkRenderPassCreateInfo2 **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);
	info->pCorrelatedViewMasks = copy(info->pCorrelatedViewMasks, info->correlatedViewMaskCount, alloc);

	if (info->pAttachments && !copy_pnext_chains(info->pAttachments, info->attachmentCount, alloc, nullptr, 0))
		return false;
	if (info->pSubpasses && !copy_pnext_chains(info->pSubpasses, info->subpassCount, alloc, nullptr, 0))
		return false;
	if (info->pDependencies && !copy_pnext_chains(info->pDependencies, info->dependencyCount, alloc, nullptr, 0))
		return false;

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription2 &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);

		if (sub.pColorAttachments && !copy_pnext_chains(sub.pColorAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pInputAttachments && !copy_pnext_chains(sub.pInputAttachments, sub.inputAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pResolveAttachments && !copy_pnext_chains(sub.pResolveAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pDepthStencilAttachment && !copy_pnext_chains(sub.pDepthStencilAttachment, 1, alloc, nullptr, 0))
			return false;
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}